

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_address_impl.c
# Opt level: O2

cio_error cio_init_inet_socket_address
                    (cio_socket_address *sock_address,cio_inet_address *inet_address,uint16_t port)

{
  cio_sa *pcVar1;
  cio_address_family cVar2;
  undefined8 uVar3;
  socklen_t sVar4;
  uint16_t uVar5;
  cio_error cVar6;
  anon_union_16_2_743aa96f_for_cio_inet_address_impl_1 *paVar7;
  
  cVar6 = CIO_INVALID_ARGUMENT;
  if ((sock_address != (cio_socket_address *)0x0) && (inet_address != (cio_inet_address *)0x0)) {
    cVar2 = (inet_address->impl).family;
    if ((cVar2 & 0xfffffff7) == CIO_ADDRESS_FAMILY_INET4) {
      pcVar1 = &(sock_address->impl).sa;
      paVar7 = &(inet_address->impl).field_1;
      if (cVar2 == CIO_ADDRESS_FAMILY_INET4) {
        *(undefined8 *)pcVar1 = 0;
        *(undefined8 *)((long)&(sock_address->impl).sa + 8) = 0;
        *(in_addr_t *)((long)&(sock_address->impl).sa + 4) = (paVar7->in).s_addr;
        sVar4 = 0x10;
      }
      else {
        *(undefined8 *)((long)&(sock_address->impl).sa + 0xc) = 0;
        *(undefined8 *)((long)&(sock_address->impl).sa + 0x14) = 0;
        *(undefined8 *)pcVar1 = 0;
        *(undefined8 *)((long)&(sock_address->impl).sa + 8) = 0;
        uVar3 = *(undefined8 *)((long)&(inet_address->impl).field_1 + 8);
        *(undefined8 *)((long)&(sock_address->impl).sa + 8) = *(undefined8 *)paVar7;
        *(undefined8 *)((long)&(sock_address->impl).sa + 0x10) = uVar3;
        sVar4 = 0x1c;
      }
      uVar5 = cio_htobe16(port);
      *(uint16_t *)(sock_address->impl).sa.socket_address.addr.sa_data = uVar5;
      (sock_address->impl).len = sVar4;
      (sock_address->impl).sa.socket_address.addr.sa_family = (sa_family_t)cVar2;
      cVar6 = CIO_SUCCESS;
    }
    else {
      cVar6 = CIO_ADDRESS_FAMILY_NOT_SUPPORTED;
    }
  }
  return cVar6;
}

Assistant:

enum cio_error cio_init_inet_socket_address(struct cio_socket_address *sock_address, const struct cio_inet_address *inet_address, uint16_t port)
{
	if (cio_unlikely((sock_address == NULL) || (inet_address == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	enum cio_address_family family = inet_address->impl.family;
	if (cio_unlikely((family != CIO_ADDRESS_FAMILY_INET4) && (family != CIO_ADDRESS_FAMILY_INET6))) {
		return CIO_ADDRESS_FAMILY_NOT_SUPPORTED;
	}

	if (family == CIO_ADDRESS_FAMILY_INET4) {
		memset(&sock_address->impl.sa.inet_addr4.impl.in, 0x0, sizeof(sock_address->impl.sa.inet_addr4.impl.in));
		memcpy(&sock_address->impl.sa.inet_addr4.impl.in.sin_addr, &inet_address->impl.in.s_addr, sizeof(inet_address->impl.in.s_addr));
		sock_address->impl.sa.inet_addr4.impl.in.sin_port = cio_htobe16(port);
		sock_address->impl.len = (socklen_t)sizeof(sock_address->impl.sa.inet_addr4.impl.in);
	} else {
		memset(&sock_address->impl.sa.inet_addr6.impl.in6, 0x0, sizeof(sock_address->impl.sa.inet_addr6.impl.in6));
		memcpy(sock_address->impl.sa.inet_addr6.impl.in6.sin6_addr.s6_addr, inet_address->impl.in6.s6_addr, sizeof(inet_address->impl.in6.s6_addr));
		sock_address->impl.sa.inet_addr6.impl.in6.sin6_port = cio_htobe16(port);
		sock_address->impl.len = (socklen_t)sizeof(sock_address->impl.sa.inet_addr6.impl.in6);
	}

	sock_address->impl.sa.socket_address.addr.sa_family = (sa_family_t)family;

	return CIO_SUCCESS;
}